

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_unix.cpp
# Opt level: O0

int __thiscall TinyProcessLib::Process::open(Process *this,char *__file,int __oflag,...)

{
  int iVar1;
  environment_type *in_RCX;
  int __oflag_00;
  anon_class_24_3_fa3802e2 local_60;
  function<void_()> local_48;
  environment_type *local_28;
  environment_type *environment_local;
  string *path_local;
  string *command_local;
  Process *this_local;
  
  local_60.environment = &local_28;
  local_60.command = (string *)__file;
  local_60.path = ___oflag;
  local_28 = in_RCX;
  environment_local = (environment_type *)___oflag;
  path_local = (string *)__file;
  command_local = (string *)this;
  std::function<void()>::
  function<TinyProcessLib::Process::open(std::__cxx11::string_const&,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const*)::__0,void>
            ((function<void()> *)&local_48,&local_60);
  iVar1 = open(this,(char *)&local_48,__oflag_00);
  std::function<void_()>::~function(&local_48);
  return iVar1;
}

Assistant:

Process::id_type Process::open(const std::string &command, const std::string &path, const environment_type *environment) noexcept {
  return open([&command, &path, &environment] {
    if(!path.empty()) {
      if(chdir(path.c_str()) != 0)
        exit(1);
    }

    if(!environment)
      execl("/bin/sh", "/bin/sh", "-c", command.c_str(), nullptr);
    else {
      std::vector<std::string> env_strs;
      std::vector<const char *> env_ptrs;
      env_strs.reserve(environment->size());
      env_ptrs.reserve(environment->size() + 1);
      for(const auto &e : *environment) {
        env_strs.emplace_back(e.first + '=' + e.second);
        env_ptrs.emplace_back(env_strs.back().c_str());
      }
      env_ptrs.emplace_back(nullptr);
      execle("/bin/sh", "/bin/sh", "-c", command.c_str(), nullptr, env_ptrs.data());
    }
  });
}